

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O1

size_t gmlc::utilities::getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                 (size_t start,basic_string_view<char,_std::char_traits<char>_> *str,char ChunkStart
                 ,char ChunkEnd)

{
  ulong uVar1;
  char *pcVar2;
  void *pvVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar1 = str->_M_len;
  pcVar2 = str->_M_str;
  iVar6 = 1;
  do {
    if (iVar6 < 1) {
      return start;
    }
    uVar5 = start + 1;
    uVar4 = 0xffffffffffffffff;
    uVar7 = 0xffffffffffffffff;
    if (uVar5 <= uVar1 && uVar1 - uVar5 != 0) {
      pvVar3 = memchr(pcVar2 + uVar5,(int)CONCAT71(in_register_00000011,ChunkStart),uVar1 - uVar5);
      uVar7 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar2;
    }
    if (uVar5 <= uVar1 && uVar1 - uVar5 != 0) {
      pvVar3 = memchr(pcVar2 + uVar5,(int)CONCAT71(in_register_00000009,ChunkEnd),uVar1 - uVar5);
      uVar4 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar2;
    }
    if (uVar4 == 0xffffffffffffffff) {
      start = 0xffffffffffffffff;
    }
    else {
      start = uVar7;
      if (uVar7 >= uVar4) {
        start = uVar4;
      }
      iVar6 = iVar6 + ((uVar7 < uVar4) - 1 | 1);
    }
  } while (uVar4 != 0xffffffffffffffff);
  return start;
}

Assistant:

size_t getChunkEnd(size_t start, const X& str, char ChunkStart, char ChunkEnd)
{
    int open = 1;
    size_t rlc = start;

    while (open > 0) {
        auto newOpen = str.find_first_of(ChunkStart, rlc + 1);
        auto newClose = str.find_first_of(ChunkEnd, rlc + 1);
        if (newClose == X::npos) {
            rlc = X::npos;
            break;
        }
        if (newOpen < newClose) {
            ++open;
            rlc = newOpen;
        } else {
            --open;
            rlc = newClose;
        }
    }
    return rlc;
}